

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int arkStep_Init(void *arkode_mem,int init_type)

{
  ARKodeHAdaptMem pAVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ARKodeButcherTable pAVar5;
  N_Vector *pp_Var6;
  realtype *prVar7;
  long lVar8;
  int iVar9;
  char *msgfmt;
  long lVar10;
  size_t sVar11;
  bool bVar12;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_40;
  ARKodeMem local_38;
  
  iVar4 = arkStep_AccessStepMem(arkode_mem,"arkStep_Init",&local_38,&local_40);
  if (iVar4 != 0) {
    return iVar4;
  }
  if (init_type == 1) {
    return 0;
  }
  if (init_type == 0) {
    bVar12 = local_38->fixedstep != 0;
    bVar2 = local_40->implicit == 0;
    bVar3 = local_38->user_efun == 0;
    if (local_38->rwt_is_ewt == 0) {
      if ((bVar2 && bVar3) && bVar12) goto LAB_004c0b61;
    }
    else if (local_40->msolve_type - SUNLINEARSOLVER_MATRIX_EMBEDDED < 0xfffffffe &&
             ((bVar2 && bVar3) && bVar12)) {
LAB_004c0b61:
      local_38->user_efun = 0;
      local_38->efun = arkEwtSetSmallReal;
      local_38->e_data = local_38;
    }
    iVar4 = arkStep_SetButcherTables(local_38);
    if (iVar4 == 0) {
      iVar4 = arkStep_CheckButcherTables(local_38);
      if (iVar4 == 0) {
        pAVar5 = local_40->Bi;
        if (pAVar5 == (ARKodeButcherTable)0x0) {
          pAVar5 = local_40->Be;
        }
        iVar4 = pAVar5->q;
        pAVar1 = local_38->hadapt_mem;
        pAVar1->q = iVar4;
        iVar9 = pAVar5->p;
        pAVar1->p = iVar9;
        local_40->q = iVar4;
        local_40->p = iVar9;
        if (iVar9 == 0 && local_38->fixedstep == 0) {
          msgfmt = "Adaptive timestepping cannot be performed without embedding coefficients";
        }
        else {
          if (local_40->explicit != 0) {
            iVar4 = local_40->stages;
            sVar11 = (size_t)iVar4;
            if (local_40->Fe == (N_Vector *)0x0) {
              pp_Var6 = (N_Vector *)calloc(sVar11,8);
              local_40->Fe = pp_Var6;
            }
            if (0 < iVar4) {
              lVar10 = 0;
              lVar8 = 0;
              do {
                iVar4 = arkAllocVec(local_38,local_38->ewt,(N_Vector *)((long)local_40->Fe + lVar10)
                                   );
                if (iVar4 == 0) {
                  return -0x14;
                }
                lVar8 = lVar8 + 1;
                sVar11 = (size_t)local_40->stages;
                lVar10 = lVar10 + 8;
              } while (lVar8 < (long)sVar11);
            }
            local_38->liw = local_38->liw + sVar11;
          }
          if (local_40->implicit == 0) {
            iVar4 = local_40->stages;
          }
          else {
            iVar4 = local_40->stages;
            sVar11 = (size_t)iVar4;
            if (local_40->Fi == (N_Vector *)0x0) {
              pp_Var6 = (N_Vector *)calloc(sVar11,8);
              local_40->Fi = pp_Var6;
            }
            if (0 < iVar4) {
              lVar10 = 0;
              lVar8 = 0;
              do {
                iVar4 = arkAllocVec(local_38,local_38->ewt,(N_Vector *)((long)local_40->Fi + lVar10)
                                   );
                if (iVar4 == 0) {
                  return -0x14;
                }
                lVar8 = lVar8 + 1;
                iVar4 = local_40->stages;
                sVar11 = (size_t)iVar4;
                lVar10 = lVar10 + 8;
              } while (lVar8 < (long)sVar11);
            }
            local_38->liw = local_38->liw + sVar11;
          }
          sVar11 = (long)local_40->nforcing + (long)iVar4 * 2 + 2;
          iVar4 = (int)sVar11;
          local_40->nfusedopvecs = iVar4;
          if (local_40->cvals == (realtype *)0x0) {
            prVar7 = (realtype *)calloc(sVar11,8);
            local_40->cvals = prVar7;
            if (prVar7 == (realtype *)0x0) {
              return -0x14;
            }
            local_38->lrw = local_38->lrw + sVar11;
          }
          if (local_40->Xvecs == (N_Vector *)0x0) {
            pp_Var6 = (N_Vector *)calloc((long)iVar4,8);
            local_40->Xvecs = pp_Var6;
            if (pp_Var6 == (N_Vector *)0x0) {
              return -0x14;
            }
            local_38->liw = local_38->liw + (long)iVar4;
          }
          if ((local_38->interp == (ARKInterp)0x0) ||
             (iVar4 = arkInterpSetDegree(local_38,local_38->interp,1 - local_40->q), iVar4 == 0)) {
            if (local_40->mass_type != 0) {
              if ((local_40->predictor & 0xfffffffeU) == 4) {
                local_40->predictor = 0;
              }
              local_38->step = arkStep_TakeStep_Z;
              goto LAB_004c0bc9;
            }
            if (local_40->predictor == 4) {
              local_38->call_fullrhs = 1;
            }
            local_38->step = arkStep_TakeStep_Z;
            goto LAB_004c0f3c;
          }
          msgfmt = "Unable to update interpolation polynomial degree";
        }
      }
      else {
        msgfmt = "Error in Butcher table(s)";
      }
    }
    else {
      msgfmt = "Could not create Butcher table(s)";
    }
LAB_004c0d24:
    iVar4 = -0x16;
    iVar9 = -0x16;
  }
  else {
    iVar4 = local_40->mass_type;
    local_38->step = arkStep_TakeStep_Z;
    if (iVar4 != 0) {
LAB_004c0bc9:
      if ((local_40->lmem != (void *)0x0) && (local_40->lsolve_type != local_40->msolve_type)) {
        msgfmt = "Incompatible linear and mass matrix solvers";
        goto LAB_004c0d24;
      }
      if ((local_40->minit != (ARKMassInitFn)0x0) &&
         (iVar4 = (*local_40->minit)(local_38), iVar4 != 0)) {
        msgfmt = "The mass matrix solver\'s init routine failed.";
        iVar4 = -0xe;
        iVar9 = -0xe;
        goto LAB_004c0d31;
      }
      if ((local_40->msetup != (ARKMassSetupFn)0x0) &&
         (iVar4 = (*local_40->msetup)(local_38,local_38->tcur,local_38->tempv1,local_38->tempv2,
                                      local_38->tempv3), iVar4 != 0)) {
        msgfmt = "The mass matrix solver\'s setup routine failed.";
        iVar4 = -0xf;
        iVar9 = -0xf;
        goto LAB_004c0d31;
      }
    }
LAB_004c0f3c:
    if ((local_40->linit == (ARKLinsolInitFn)0x0) ||
       (iVar4 = (*local_40->linit)(local_38), iVar4 == 0)) {
      if (local_40->NLS == (SUNNonlinearSolver)0x0) {
        return 0;
      }
      iVar4 = arkStep_NlsInit(local_38);
      if (iVar4 == 0) {
        return 0;
      }
      msgfmt = "Unable to initialize SUNNonlinearSolver object";
      iVar4 = -0x1d;
      iVar9 = -0x1d;
    }
    else {
      msgfmt = "The linear solver\'s init routine failed.";
      iVar4 = -5;
      iVar9 = -5;
    }
  }
LAB_004c0d31:
  arkProcessError(local_38,iVar9,"ARKode::ARKStep","arkStep_Init",msgfmt);
  return iVar4;
}

Assistant:

int arkStep_Init(void* arkode_mem, int init_type)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int j, retval;
  booleantype reset_efun;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_Init",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* immediately return if reset */
  if (init_type == RESET_INIT) return(ARK_SUCCESS);

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT) {

    /* enforce use of arkEwtSmallReal if using a fixed step size for
       an explicit method, an internal error weight function, and not
       using an iterative mass matrix solver with rwt=ewt */
    reset_efun = SUNTRUE;
    if ( step_mem->implicit )   reset_efun = SUNFALSE;
    if ( !ark_mem->fixedstep )  reset_efun = SUNFALSE;
    if ( ark_mem->user_efun )   reset_efun = SUNFALSE;
    if ( ark_mem->rwt_is_ewt && (step_mem->msolve_type == SUNLINEARSOLVER_ITERATIVE) )
      reset_efun = SUNFALSE;
    if ( ark_mem->rwt_is_ewt && (step_mem->msolve_type == SUNLINEARSOLVER_MATRIX_ITERATIVE) )
      reset_efun = SUNFALSE;
    if (reset_efun) {
      ark_mem->user_efun = SUNFALSE;
      ark_mem->efun      = arkEwtSetSmallReal;
      ark_mem->e_data    = ark_mem;
    }

    /* Create Butcher tables (if not already set) */
    retval = arkStep_SetButcherTables(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                      "Could not create Butcher table(s)");
      return(ARK_ILL_INPUT);
    }

    /* Check that Butcher tables are OK */
    retval = arkStep_CheckButcherTables(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_Init", "Error in Butcher table(s)");
      return(ARK_ILL_INPUT);
    }

    /* Retrieve/store method and embedding orders now that tables are finalized */
    if (step_mem->Bi != NULL) {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Bi->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Bi->p;
    } else {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Be->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Be->p;
    }

    /* Ensure that if adaptivity is enabled, then method includes embedding coefficients */
    if (!ark_mem->fixedstep && (step_mem->p == 0)) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                      "Adaptive timestepping cannot be performed without embedding coefficients");
      return(ARK_ILL_INPUT);
    }

    /* Allocate ARK RHS vector memory, update storage requirements */
    /*   Allocate Fe[0] ... Fe[stages-1] if needed */
    if (step_mem->explicit) {
      if (step_mem->Fe == NULL)
        step_mem->Fe = (N_Vector *) calloc(step_mem->stages, sizeof(N_Vector));
      for (j=0; j<step_mem->stages; j++) {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fe[j])))
          return(ARK_MEM_FAIL);
      }
      ark_mem->liw += step_mem->stages;  /* pointers */
    }

    /*   Allocate Fi[0] ... Fi[stages-1] if needed */
    if (step_mem->implicit) {
      if (step_mem->Fi == NULL)
        step_mem->Fi = (N_Vector *) calloc(step_mem->stages, sizeof(N_Vector));
      for (j=0; j<step_mem->stages; j++) {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fi[j])))
          return(ARK_MEM_FAIL);
      }
      ark_mem->liw += step_mem->stages;  /* pointers */
    }

    /* Allocate reusable arrays for fused vector operations */
    step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + step_mem->nforcing;
    if (step_mem->cvals == NULL) {
      step_mem->cvals = (realtype *) calloc(step_mem->nfusedopvecs,
                                            sizeof(realtype));
      if (step_mem->cvals == NULL)  return(ARK_MEM_FAIL);
      ark_mem->lrw += step_mem->nfusedopvecs;
    }
    if (step_mem->Xvecs == NULL) {
      step_mem->Xvecs = (N_Vector *) calloc(step_mem->nfusedopvecs,
                                            sizeof(N_Vector));
      if (step_mem->Xvecs == NULL)  return(ARK_MEM_FAIL);
      ark_mem->liw += step_mem->nfusedopvecs;   /* pointers */
    }

    /* Limit interpolant degree based on method order (use negative
       argument to specify update instead of overwrite) */
    if (ark_mem->interp != NULL) {
      retval = arkInterpSetDegree(ark_mem, ark_mem->interp, -(step_mem->q-1));
      if (retval != ARK_SUCCESS) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                        "Unable to update interpolation polynomial degree");
        return(ARK_ILL_INPUT);
      }
    }

    /* If configured with either predictor 4 or 5 and a non-identity mass
       matrix, reset to trivial predictor */
    if (step_mem->mass_type != MASS_IDENTITY)
      if ((step_mem->predictor == 4) || (step_mem->predictor == 5))
        step_mem->predictor = 0;

    /* If the bootstrap predictor is enabled, signal to shared arkode module that
       fullrhs is required after each step */
    if (step_mem->predictor == 4)  ark_mem->call_fullrhs = SUNTRUE;
  }

  /* set appropriate TakeStep routine based on problem configuration */
  /*    (only one choice for now) */
  ark_mem->step = arkStep_TakeStep_Z;

  /* Check for consistency between mass system and system linear system modules
     (e.g., if lsolve is direct, msolve needs to match) */
  if ((step_mem->mass_type != MASS_IDENTITY) && step_mem->lmem) {
    if (step_mem->lsolve_type != step_mem->msolve_type) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                      "Incompatible linear and mass matrix solvers");
      return(ARK_ILL_INPUT);
    }
  }

  /* Perform mass matrix solver initialization and setup (if applicable) */
  if (step_mem->mass_type != MASS_IDENTITY) {

    /* Call minit (if it exists) */
    if (step_mem->minit != NULL) {
      retval = step_mem->minit((void *) ark_mem);
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_MASSINIT_FAIL, "ARKode::ARKStep",
                        "arkStep_Init", MSG_ARK_MASSINIT_FAIL);
        return(ARK_MASSINIT_FAIL);
      }
    }

    /* Call msetup (if it exists) */
    if (step_mem->msetup != NULL) {
      retval = step_mem->msetup((void *) ark_mem, ark_mem->tcur,
                                ark_mem->tempv1, ark_mem->tempv2,
                                ark_mem->tempv3);
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_MASSSETUP_FAIL, "ARKode::ARKStep",
                        "arkStep_Init", MSG_ARK_MASSSETUP_FAIL);
        return(ARK_MASSSETUP_FAIL);
      }
    }
  }

  /* Call linit (if it exists) */
  if (step_mem->linit) {
    retval = step_mem->linit(ark_mem);
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_LINIT_FAIL, "ARKode::ARKStep",
                      "arkStep_Init", MSG_ARK_LINIT_FAIL);
      return(ARK_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver object (if it exists) */
  if (step_mem->NLS) {
    retval = arkStep_NlsInit(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_NLS_INIT_FAIL, "ARKode::ARKStep", "arkStep_Init",
                      "Unable to initialize SUNNonlinearSolver object");
      return(ARK_NLS_INIT_FAIL);
    }
  }

  return(ARK_SUCCESS);
}